

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O1

void __thiscall Js::Profiler::Suspend(Profiler *this,Phase tag,SuspendRecord *suspendRecord)

{
  uint uVar1;
  uint uVar2;
  TimeEntry *pTVar3;
  TimeStamp TVar4;
  Phase PVar5;
  TimeEntry curEntry;
  
  suspendRecord->count = 0;
  do {
    pTVar3 = FixedStack<Js::TimeEntry,_20>::Peek(&this->timeStack);
    uVar1 = *(uint *)pTVar3;
    TVar4 = GetTime();
    curEntry._4_4_ = 0;
    curEntry._0_4_ = uVar1;
    curEntry.time = TVar4;
    Pop(this,curEntry);
    uVar2 = suspendRecord->count;
    suspendRecord->count = uVar2 + 1;
    PVar5 = (Phase)uVar1;
    suspendRecord->phase[uVar2] = PVar5;
  } while (PVar5 != tag);
  return;
}

Assistant:

void
    Profiler::Suspend(Phase tag, SuspendRecord * suspendRecord)
    {
        suspendRecord->count = 0;
        Phase topTag;
        do
        {
            topTag = timeStack.Peek()->tag;
            Pop(TimeEntry(topTag, GetTime()));
            suspendRecord->phase[suspendRecord->count++] = topTag;
        } while(topTag != tag);
    }